

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_ts2ci.c
# Opt level: O0

uint32 * mk_ts2ci(model_def_t *mdef)

{
  uint uVar1;
  acmod_set_t *acmod_set_00;
  acmod_id_t aVar2;
  uint32 *puVar3;
  acmod_set_t *acmod_set;
  uint32 ts;
  uint32 *map;
  uint32 j;
  uint32 i;
  model_def_t *mdef_local;
  
  acmod_set_00 = mdef->acmod_set;
  puVar3 = (uint32 *)
           __ckd_calloc__((ulong)mdef->n_tied_state,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_ts2ci.c"
                          ,0x3e);
  for (map._4_4_ = 0; map._4_4_ < mdef->n_tied_state; map._4_4_ = map._4_4_ + 1) {
    puVar3[map._4_4_] = 0xffffffff;
  }
  map._4_4_ = 0;
  do {
    if (mdef->n_defn <= map._4_4_) {
      for (map._4_4_ = 0; map._4_4_ < mdef->n_tied_state; map._4_4_ = map._4_4_ + 1) {
        if (puVar3[map._4_4_] == 0xffffffff) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_ts2ci.c"
                  ,0x50,"state %d has no mapping to a CI phone\n",(ulong)map._4_4_);
        }
      }
      return puVar3;
    }
    for (map._0_4_ = 0; (uint)map < mdef->defn[map._4_4_].n_state; map._0_4_ = (uint)map + 1) {
      uVar1 = mdef->defn[map._4_4_].state[(uint)map];
      if ((uVar1 != 0xffffffff) && (puVar3[uVar1] == 0xffffffff)) {
        if (mdef->n_tied_state <= uVar1) {
          __assert_fail("ts < mdef->n_tied_state",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_ts2ci.c"
                        ,0x47,"uint32 *mk_ts2ci(model_def_t *)");
        }
        aVar2 = acmod_set_base_phone(acmod_set_00,map._4_4_);
        puVar3[uVar1] = aVar2;
      }
    }
    map._4_4_ = map._4_4_ + 1;
  } while( true );
}

Assistant:

uint32 *
mk_ts2ci(model_def_t *mdef)
{
    uint32 i, j;
    uint32 *map;
    uint32 ts;
    acmod_set_t *acmod_set = mdef->acmod_set;

    map = (uint32 *)ckd_calloc(mdef->n_tied_state, sizeof(uint32));

    for (i = 0; i < mdef->n_tied_state; i++)
	map[i] = TYING_NO_ID;

    for (i = 0; i < mdef->n_defn; i++) {
	for (j = 0; j < mdef->defn[i].n_state; j++) {
	    ts = mdef->defn[i].state[j];
	    if ((ts != TYING_NON_EMITTING) && (map[ts] == TYING_NO_ID)) {
		assert(ts < mdef->n_tied_state);

		map[ts] = acmod_set_base_phone(acmod_set, i);
	    }
	}
    }

    for (i = 0; i < mdef->n_tied_state; i++) {
	if (map[i] == TYING_NO_ID) {
	    E_WARN("state %d has no mapping to a CI phone\n", i);
	}
    }

    return map;
}